

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralCurveConnection::~IfcStructuralCurveConnection
          (IfcStructuralCurveConnection *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  *(undefined8 *)&this[-1].super_IfcStructuralConnection.field_0x28 = 0x7f6178;
  *(undefined8 *)&(this->super_IfcStructuralConnection).field_0x10 = 0x7f61f0;
  *(undefined8 *)&this[-1].super_IfcStructuralConnection.field_0xb0 = 0x7f61a0;
  *(undefined8 *)&this[-1].super_IfcStructuralConnection.field_0xc0 = 0x7f61c8;
  puVar2 = *(undefined1 **)&this[-1].super_IfcStructuralConnection.field_0xd0;
  puVar1 = &this[-1].super_IfcStructuralConnection.field_0xe0;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  *(undefined8 *)&this[-1].super_IfcStructuralConnection.field_0x28 = 0x7f6290;
  *(undefined8 *)&(this->super_IfcStructuralConnection).field_0x10 = 0x7f62b8;
  puVar2 = *(undefined1 **)&this[-1].super_IfcStructuralConnection.field_0x88;
  puVar1 = &this[-1].super_IfcStructuralConnection.field_0x98;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  puVar2 = *(undefined1 **)&this[-1].super_IfcStructuralConnection.field_0x60;
  puVar1 = &this[-1].super_IfcStructuralConnection.field_0x70;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  puVar1 = *(undefined1 **)&this[-1].super_IfcStructuralConnection.field_0x38;
  puVar2 = &this[-1].super_IfcStructuralConnection.field_0x48;
  if (puVar1 != puVar2) {
    operator_delete(puVar1,*(long *)puVar2 + 1);
  }
  operator_delete(&this[-1].super_IfcStructuralConnection.field_0x28,0x158);
  return;
}

Assistant:

IfcStructuralCurveConnection() : Object("IfcStructuralCurveConnection") {}